

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sum.cpp
# Opt level: O1

AggregateFunction *
duckdb::GetSumAggregateNoOverflow(AggregateFunction *__return_storage_ptr__,PhysicalType type)

{
  BinderException *this;
  int iVar1;
  undefined7 in_register_00000031;
  FunctionNullHandling in_R8B;
  undefined1 local_70 [56];
  LogicalType local_38;
  
  iVar1 = (int)CONCAT71(in_register_00000031,type);
  if (iVar1 == 9) {
    LogicalType::LogicalType((LogicalType *)local_70,BIGINT);
    LogicalType::LogicalType((LogicalType *)(local_70 + 0x20),HUGEINT);
    AggregateFunction::
    UnaryAggregate<duckdb::SumState<long>,long,duckdb::hugeint_t,duckdb::IntegerSumOperation,(duckdb::AggregateDestructorType)0>
              (__return_storage_ptr__,(AggregateFunction *)local_70,(LogicalType *)(local_70 + 0x20)
               ,(LogicalType *)0x0,in_R8B);
    LogicalType::~LogicalType((LogicalType *)(local_70 + 0x20));
    LogicalType::~LogicalType((LogicalType *)local_70);
    ::std::__cxx11::string::_M_replace
              ((ulong)&(__return_storage_ptr__->super_BaseScalarFunction).super_SimpleFunction.
                       super_Function.name,0,
               (char *)(__return_storage_ptr__->super_BaseScalarFunction).super_SimpleFunction.
                       super_Function.name._M_string_length,0x1f1942b);
  }
  else {
    if (iVar1 != 7) {
      this = (BinderException *)__cxa_allocate_exception(0x10);
      local_70._0_8_ = local_70 + 0x10;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_70,"Unsupported internal type for sum_no_overflow","");
      BinderException::BinderException(this,(string *)local_70);
      __cxa_throw(this,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
    }
    LogicalType::LogicalType((LogicalType *)local_70,INTEGER);
    LogicalType::LogicalType(&local_38,HUGEINT);
    AggregateFunction::
    UnaryAggregate<duckdb::SumState<long>,int,duckdb::hugeint_t,duckdb::IntegerSumOperation,(duckdb::AggregateDestructorType)0>
              (__return_storage_ptr__,(AggregateFunction *)local_70,&local_38,(LogicalType *)0x0,
               in_R8B);
    LogicalType::~LogicalType(&local_38);
    LogicalType::~LogicalType((LogicalType *)local_70);
    ::std::__cxx11::string::_M_replace
              ((ulong)&(__return_storage_ptr__->super_BaseScalarFunction).super_SimpleFunction.
                       super_Function.name,0,
               (char *)(__return_storage_ptr__->super_BaseScalarFunction).super_SimpleFunction.
                       super_Function.name._M_string_length,0x1f1942b);
  }
  __return_storage_ptr__->order_dependent = NOT_ORDER_DEPENDENT;
  __return_storage_ptr__->bind = SumNoOverflowBind;
  __return_storage_ptr__->serialize = SumNoOverflowSerialize;
  __return_storage_ptr__->deserialize = SumNoOverflowDeserialize;
  return __return_storage_ptr__;
}

Assistant:

AggregateFunction GetSumAggregateNoOverflow(PhysicalType type) {
	switch (type) {
	case PhysicalType::INT32: {
		auto function = AggregateFunction::UnaryAggregate<SumState<int64_t>, int32_t, hugeint_t, IntegerSumOperation>(
		    LogicalType::INTEGER, LogicalType::HUGEINT);
		function.name = "sum_no_overflow";
		function.order_dependent = AggregateOrderDependent::NOT_ORDER_DEPENDENT;
		function.bind = SumNoOverflowBind;
		function.serialize = SumNoOverflowSerialize;
		function.deserialize = SumNoOverflowDeserialize;
		return function;
	}
	case PhysicalType::INT64: {
		auto function = AggregateFunction::UnaryAggregate<SumState<int64_t>, int64_t, hugeint_t, IntegerSumOperation>(
		    LogicalType::BIGINT, LogicalType::HUGEINT);
		function.name = "sum_no_overflow";
		function.order_dependent = AggregateOrderDependent::NOT_ORDER_DEPENDENT;
		function.bind = SumNoOverflowBind;
		function.serialize = SumNoOverflowSerialize;
		function.deserialize = SumNoOverflowDeserialize;
		return function;
	}
	default:
		throw BinderException("Unsupported internal type for sum_no_overflow");
	}
}